

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void * xm_get_sample_waveform(xm_context_t *ctx,uint16_t i,uint16_t s,size_t *size,uint8_t *bits)

{
  ulong *in_RCX;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  undefined1 *in_R8;
  
  if ((in_SI == 0) || (*(ushort *)(in_RDI + 0x10) < in_SI)) {
    fprintf(_stderr,"%s(): invalid instrument %d\n","xm_get_sample_waveform",(ulong)in_SI);
    fflush(_stderr);
  }
  if (*(ushort *)(*(long *)(in_RDI + 0x120) + (ulong)in_SI * 0xf8) < in_DX) {
    fprintf(_stderr,"%s(): invalid sample %d for instrument %d\n","xm_get_sample_waveform",
            (ulong)in_DX,(ulong)in_SI);
    fflush(_stderr);
  }
  *in_RCX = (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x120) + (long)(int)(in_SI - 1) * 0xf8 +
                                      0xf0) + (ulong)in_DX * 0x38 + 4);
  *in_R8 = *(undefined1 *)
            (*(long *)(*(long *)(in_RDI + 0x120) + (long)(int)(in_SI - 1) * 0xf8 + 0xf0) +
            (ulong)in_DX * 0x38);
  return *(void **)(*(long *)(*(long *)(in_RDI + 0x120) + (long)(int)(in_SI - 1) * 0xf8 + 0xf0) +
                    (ulong)in_DX * 0x38 + 0x30);
}

Assistant:

void* xm_get_sample_waveform(xm_context_t* ctx, uint16_t i, uint16_t s, size_t* size, uint8_t* bits) {
	CHECK_SAMPLE(ctx, i, s);
	*size = ctx->module.instruments[i - 1].samples[s].length;
	*bits = ctx->module.instruments[i - 1].samples[s].bits;
	return ctx->module.instruments[i - 1].samples[s].data8;
}